

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O0

void __thiscall cmLBDepend::DependWalk(cmLBDepend *this,cmDependInformation *info)

{
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  long lVar4;
  reference pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  undefined1 local_560 [8];
  string path_3;
  iterator __end5_2;
  iterator __begin5_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  undefined1 local_4c8 [8];
  string path_2;
  iterator __end5_1;
  iterator __begin5_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  undefined1 local_430 [8];
  string path_1;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  undefined1 local_398 [8];
  string path;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_358 [7];
  bool found;
  undefined1 local_338 [8];
  string root;
  size_type pos;
  string cxxFile;
  undefined1 local_2e8 [8];
  string message;
  string includeFile;
  size_t qend;
  size_t qstart;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_220;
  ifstream fin;
  cmDependInformation *info_local;
  cmLBDepend *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_220,pcVar3,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)&qstart);
LAB_002f349a:
    do {
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&local_220,(string *)&qstart,(bool *)0x0,-1);
      if (!bVar2) goto LAB_002f408e;
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,9ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &qstart,(char (*) [9])"#include");
      if (bVar2) {
        lVar4 = std::__cxx11::string::find((char)&qstart,0x22);
        if (lVar4 == -1) {
          lVar4 = std::__cxx11::string::find((char)&qstart,0x3c);
          if (lVar4 == -1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&includeFile.field_2 + 8),"unknown include directive ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &qstart);
            cmSystemTools::Error((string *)((long)&includeFile.field_2 + 8));
            std::__cxx11::string::~string((string *)(includeFile.field_2._M_local_buf + 8));
            goto LAB_002f349a;
          }
          std::__cxx11::string::find((char)&qstart,0x3e);
        }
        else {
          std::__cxx11::string::find((char)&qstart,0x22);
        }
        std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)&qstart);
        bVar2 = cmsys::RegularExpression::find
                          (&this->IncludeFileRegularExpression,
                           (string *)((long)&message.field_2 + 8));
        if (bVar2) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          AddDependency(this,info,pcVar3);
          std::__cxx11::string::string((string *)&pos,(string *)(message.field_2._M_local_buf + 8));
          root.field_2._8_8_ = std::__cxx11::string::rfind((char)&pos,0x2e);
          if (root.field_2._8_8_ != -1) {
            std::__cxx11::string::substr((ulong)local_338,(ulong)&pos);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_358,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_338,".cxx");
            std::__cxx11::string::operator=((string *)&pos,(string *)local_358);
            std::__cxx11::string::~string((string *)local_358);
            __range4._7_1_ = cmsys::SystemTools::FileExists((string *)&pos);
            __end4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->IncludeDirectories);
            path.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->IncludeDirectories);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)((long)&path.field_2 + 8)), bVar2) {
              pbVar5 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end4);
              std::__cxx11::string::string((string *)local_398,(string *)pbVar5);
              std::operator+(&local_3b8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398,"/");
              std::__cxx11::string::operator=((string *)local_398,(string *)&local_3b8);
              std::__cxx11::string::~string((string *)&local_3b8);
              std::operator+(&local_3d8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_398,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pos);
              std::__cxx11::string::operator=((string *)local_398,(string *)&local_3d8);
              std::__cxx11::string::~string((string *)&local_3d8);
              bVar2 = cmsys::SystemTools::FileExists((string *)local_398);
              if (bVar2) {
                __range4._7_1_ = true;
              }
              std::__cxx11::string::~string((string *)local_398);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end4);
            }
            if (__range4._7_1_ == false) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range5,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_338,".cpp");
              std::__cxx11::string::operator=((string *)&pos,(string *)&__range5);
              std::__cxx11::string::~string((string *)&__range5);
              bVar2 = cmsys::SystemTools::FileExists((string *)&pos);
              if (bVar2) {
                __range4._7_1_ = true;
              }
              __end5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&this->IncludeDirectories);
              path_1.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->IncludeDirectories);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)((long)&path_1.field_2 + 8)), bVar2) {
                pbVar5 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&__end5);
                std::__cxx11::string::string((string *)local_430,(string *)pbVar5);
                std::operator+(&local_450,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_430,"/");
                std::__cxx11::string::operator=((string *)local_430,(string *)&local_450);
                std::__cxx11::string::~string((string *)&local_450);
                std::operator+(&local_470,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_430,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pos);
                std::__cxx11::string::operator=((string *)local_430,(string *)&local_470);
                std::__cxx11::string::~string((string *)&local_470);
                bVar2 = cmsys::SystemTools::FileExists((string *)local_430);
                if (bVar2) {
                  __range4._7_1_ = true;
                }
                std::__cxx11::string::~string((string *)local_430);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end5);
              }
            }
            if (__range4._7_1_ == false) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range5_1,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_338,".c");
              std::__cxx11::string::operator=((string *)&pos,(string *)&__range5_1);
              std::__cxx11::string::~string((string *)&__range5_1);
              bVar2 = cmsys::SystemTools::FileExists((string *)&pos);
              if (bVar2) {
                __range4._7_1_ = true;
              }
              __end5_1 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(&this->IncludeDirectories);
              path_2.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->IncludeDirectories);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end5_1,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&path_2.field_2 + 8)), bVar2) {
                pbVar5 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&__end5_1);
                std::__cxx11::string::string((string *)local_4c8,(string *)pbVar5);
                std::operator+(&local_4e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8,"/");
                std::__cxx11::string::operator=((string *)local_4c8,(string *)&local_4e8);
                std::__cxx11::string::~string((string *)&local_4e8);
                std::operator+(&local_508,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_4c8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pos);
                std::__cxx11::string::operator=((string *)local_4c8,(string *)&local_508);
                std::__cxx11::string::~string((string *)&local_508);
                bVar2 = cmsys::SystemTools::FileExists((string *)local_4c8);
                if (bVar2) {
                  __range4._7_1_ = true;
                }
                std::__cxx11::string::~string((string *)local_4c8);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end5_1);
              }
            }
            if (__range4._7_1_ == false) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__range5_2,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_338,".txx");
              std::__cxx11::string::operator=((string *)&pos,(string *)&__range5_2);
              std::__cxx11::string::~string((string *)&__range5_2);
              bVar2 = cmsys::SystemTools::FileExists((string *)&pos);
              if (bVar2) {
                __range4._7_1_ = true;
              }
              __end5_2 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(&this->IncludeDirectories);
              path_3.field_2._8_8_ =
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&this->IncludeDirectories);
              while (bVar2 = __gnu_cxx::operator!=
                                       (&__end5_2,
                                        (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)((long)&path_3.field_2 + 8)), bVar2) {
                pbVar5 = __gnu_cxx::
                         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&__end5_2);
                std::__cxx11::string::string((string *)local_560,(string *)pbVar5);
                std::operator+(&local_580,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_560,"/");
                std::__cxx11::string::operator=((string *)local_560,(string *)&local_580);
                std::__cxx11::string::~string((string *)&local_580);
                std::operator+(&local_5a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_560,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &pos);
                std::__cxx11::string::operator=((string *)local_560,(string *)&local_5a0);
                std::__cxx11::string::~string((string *)&local_5a0);
                bVar2 = cmsys::SystemTools::FileExists((string *)local_560);
                if (bVar2) {
                  __range4._7_1_ = true;
                }
                std::__cxx11::string::~string((string *)local_560);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end5_2);
              }
            }
            if (__range4._7_1_ != false) {
              pcVar3 = (char *)std::__cxx11::string::c_str();
              AddDependency(this,info,pcVar3);
            }
            std::__cxx11::string::~string((string *)local_338);
          }
          std::__cxx11::string::~string((string *)&pos);
          line.field_2._12_4_ = 0;
        }
        else {
          if ((this->Verbose & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_2e8,"Skipping ",
                       (allocator<char> *)(cxxFile.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(cxxFile.field_2._M_local_buf + 0xf));
            std::__cxx11::string::operator+=
                      ((string *)local_2e8,(string *)(message.field_2._M_local_buf + 8));
            std::__cxx11::string::operator+=((string *)local_2e8," for file ");
            std::__cxx11::string::operator+=((string *)local_2e8,(string *)&info->FullPath);
            cmSystemTools::Error((string *)local_2e8);
            std::__cxx11::string::~string((string *)local_2e8);
          }
          line.field_2._12_4_ = 2;
        }
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
      }
    } while( true );
  }
  std::operator+(&local_250,"error can not open ",&info->FullPath);
  cmSystemTools::Error(&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  line.field_2._12_4_ = 1;
LAB_002f40a4:
  std::ifstream::~ifstream(&local_220);
  return;
LAB_002f408e:
  std::__cxx11::string::~string((string *)&qstart);
  line.field_2._12_4_ = 0;
  goto LAB_002f40a4;
}

Assistant:

void DependWalk(cmDependInformation* info)
  {
    cmsys::ifstream fin(info->FullPath.c_str());
    if (!fin) {
      cmSystemTools::Error("error can not open " + info->FullPath);
      return;
    }

    std::string line;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      if (cmHasLiteralPrefix(line, "#include")) {
        // if it is an include line then create a string class
        size_t qstart = line.find('\"', 8);
        size_t qend;
        // if a quote is not found look for a <
        if (qstart == std::string::npos) {
          qstart = line.find('<', 8);
          // if a < is not found then move on
          if (qstart == std::string::npos) {
            cmSystemTools::Error("unknown include directive " + line);
            continue;
          }
          qend = line.find('>', qstart + 1);
        } else {
          qend = line.find('\"', qstart + 1);
        }
        // extract the file being included
        std::string includeFile = line.substr(qstart + 1, qend - qstart - 1);
        // see if the include matches the regular expression
        if (!this->IncludeFileRegularExpression.find(includeFile)) {
          if (this->Verbose) {
            std::string message = "Skipping ";
            message += includeFile;
            message += " for file ";
            message += info->FullPath;
            cmSystemTools::Error(message);
          }
          continue;
        }

        // Add this file and all its dependencies.
        this->AddDependency(info, includeFile.c_str());
        /// add the cxx file if it exists
        std::string cxxFile = includeFile;
        std::string::size_type pos = cxxFile.rfind('.');
        if (pos != std::string::npos) {
          std::string root = cxxFile.substr(0, pos);
          cxxFile = root + ".cxx";
          bool found = false;
          // try jumping to .cxx .cpp and .c in order
          if (cmSystemTools::FileExists(cxxFile)) {
            found = true;
          }
          for (std::string path : this->IncludeDirectories) {
            path = path + "/";
            path = path + cxxFile;
            if (cmSystemTools::FileExists(path)) {
              found = true;
            }
          }
          if (!found) {
            cxxFile = root + ".cpp";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (!found) {
            cxxFile = root + ".c";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (!found) {
            cxxFile = root + ".txx";
            if (cmSystemTools::FileExists(cxxFile)) {
              found = true;
            }
            for (std::string path : this->IncludeDirectories) {
              path = path + "/";
              path = path + cxxFile;
              if (cmSystemTools::FileExists(path)) {
                found = true;
              }
            }
          }
          if (found) {
            this->AddDependency(info, cxxFile.c_str());
          }
        }
      }
    }
  }